

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O1

void pnga_elem_maximum(Integer g_a,Integer g_b,Integer g_c)

{
  long lVar1;
  long lVar2;
  long local_1d8;
  long local_1d0;
  Integer local_1c8;
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer clo [7];
  Integer bhi [7];
  Integer blo [7];
  Integer ahi [7];
  Integer alo [7];
  Integer chi [7];
  
  pnga_inquire(g_a,&atype,&local_1c8,ahi);
  pnga_inquire(g_b,&btype,&local_1d0,bhi);
  pnga_inquire(g_c,&ctype,&local_1d8,chi);
  if ((local_1c8 != local_1d0) || (local_1c8 != local_1d8)) {
    pnga_error("global arrays have different dimmensions.",local_1c8);
  }
  if (local_1c8 != 0) {
    lVar2 = -1;
    lVar1 = 0;
    do {
      alo[local_1c8 + lVar2] = 1;
      blo[local_1d0 + lVar2] = 1;
      clo[local_1d8 + lVar2] = 1;
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (local_1c8 != lVar1);
    local_1c8 = 0;
    local_1d0 = local_1d0 - lVar1;
    local_1d8 = local_1d8 - lVar1;
  }
  _ga_sync_begin = 1;
  ngai_elem2_patch_(g_a,alo,ahi,g_b,blo,bhi,g_c,clo,chi,5);
  return;
}

Assistant:

void pnga_elem_maximum(Integer g_a, Integer g_b, Integer g_c){

   Integer atype, andim;
   Integer btype, bndim;
   Integer ctype, cndim;
   Integer alo[MAXDIM],ahi[MAXDIM];
   Integer blo[MAXDIM],bhi[MAXDIM];
   Integer clo[MAXDIM],chi[MAXDIM];

    pnga_inquire(g_a,  &atype, &andim, ahi);
    pnga_inquire(g_b,  &btype, &bndim, bhi);
    pnga_inquire(g_c,  &ctype, &cndim, chi);
    if((andim!=bndim)||(andim!=cndim))
        pnga_error("global arrays have different dimmensions.", andim);
    while(andim){
        alo[andim-1]=1;
        blo[bndim-1]=1;
        clo[cndim-1]=1;
        andim--;
        bndim--;
        cndim--;
    }

    _ga_sync_begin = 1; /*just to be on the safe side*/
    ngai_elem2_patch_(g_a, alo, ahi, g_b, blo, bhi,g_c,clo,chi,OP_ELEM_MAX);

}